

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTypes.h
# Opt level: O3

bool __thiscall MiniScript::Value::operator==(Value *this,Value *rhs)

{
  long *plVar1;
  StringStorage *lhs;
  StringStorage *rhs_00;
  SeqElemStorage *lhs_00;
  SeqElemStorage *rhs_01;
  anon_union_8_3_2f476f46_for_data aVar2;
  ValueType VVar3;
  bool bVar4;
  Value local_28;
  Value local_18;
  
  if (this->type == rhs->type) {
    bVar4 = true;
    switch(this->type) {
    case Null:
      goto switchD_0011a1db_caseD_0;
    case Number:
      return (bool)(-((rhs->data).number == (this->data).number) & 1);
    case Temp:
      return (this->data).tempNum == (rhs->data).tempNum;
    case String:
    case Var:
      lhs = (StringStorage *)(this->data).ref;
      rhs_00 = (StringStorage *)(rhs->data).ref;
      if (lhs == rhs_00) {
        return true;
      }
      if (rhs_00 != (StringStorage *)0x0 && lhs != (StringStorage *)0x0) {
        bVar4 = Equal(lhs,rhs_00);
        return bVar4;
      }
      break;
    case List:
      local_18.data = (anon_union_8_3_2f476f46_for_data)(rhs->data).ref;
      if ((this->data).ref == local_18.data.ref) {
        return true;
      }
      if (local_18.data.ref != (RefCountedStorage *)0x0 &&
          (this->data).ref != (RefCountedStorage *)0x0) {
        local_18.type = List;
        local_18.noInvoke = rhs->noInvoke;
        local_18.localOnly = rhs->localOnly;
        (local_18.data.ref)->refCount = (local_18.data.ref)->refCount + 1;
        bVar4 = RecursiveEqual(this,&local_18);
        aVar2 = local_18.data;
        VVar3 = local_18.type;
joined_r0x0011a308:
        if (VVar3 < String) {
          return bVar4;
        }
        if (aVar2.ref == (RefCountedStorage *)0x0) {
          return bVar4;
        }
        plVar1 = &(aVar2.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 != 0) {
          return bVar4;
        }
        (*(aVar2.ref)->_vptr_RefCountedStorage[1])();
        return bVar4;
      }
      break;
    case Map:
      local_28.data = (anon_union_8_3_2f476f46_for_data)(rhs->data).ref;
      if ((this->data).ref == local_28.data.ref) {
        return true;
      }
      if (local_28.data.ref != (RefCountedStorage *)0x0 &&
          (this->data).ref != (RefCountedStorage *)0x0) {
        local_28.type = Map;
        local_28.noInvoke = rhs->noInvoke;
        local_28.localOnly = rhs->localOnly;
        (local_28.data.ref)->refCount = (local_28.data.ref)->refCount + 1;
        bVar4 = RecursiveEqual(this,&local_28);
        aVar2 = local_28.data;
        VVar3 = local_28.type;
        goto joined_r0x0011a308;
      }
      break;
    case Function:
    case Handle:
      return (this->data).ref == (rhs->data).ref;
    case SeqElem:
      lhs_00 = (SeqElemStorage *)(this->data).ref;
      rhs_01 = (SeqElemStorage *)(rhs->data).ref;
      if (lhs_00 == rhs_01) {
        return true;
      }
      if (rhs_01 != (SeqElemStorage *)0x0 && lhs_00 != (SeqElemStorage *)0x0) {
        bVar4 = Equal(lhs_00,rhs_01);
        return bVar4;
      }
    }
  }
  bVar4 = false;
switchD_0011a1db_caseD_0:
  return bVar4;
}

Assistant:

inline bool Value::operator==(const Value& rhs) const {
		if (type != rhs.type) return false;
		switch (type) {
			case ValueType::Null:
				return true;		// null values are always equal
				
			case ValueType::Number:
				return data.number == rhs.data.number;
				
			case ValueType::String:
			case ValueType::Var:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return Equal((StringStorage*)data.ref, (StringStorage*)rhs.data.ref);
			}
			case ValueType::List:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return RecursiveEqual(rhs);
			}
			case ValueType::Map:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return RecursiveEqual(rhs);
			}
			case ValueType::Function:
				// Two functions are equal only if they refer to the exact same function
				return (data.ref == rhs.data.ref);

			case ValueType::Temp:
				return (data.tempNum == rhs.data.tempNum);
				
			case ValueType::SeqElem:
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return Equal((SeqElemStorage*)data.ref, (SeqElemStorage*)rhs.data.ref);
			
			case ValueType::Handle:
				return (data.ref == rhs.data.ref);
		}
		return false;
	}